

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

AggregateFunctionSet * duckdb::ReservoirQuantileFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_c1;
  LogicalType local_c0 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType(local_c0,DECIMAL);
  LogicalType::LogicalType(local_c0 + 1,DOUBLE);
  __l._M_len = 2;
  __l._M_array = local_c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,(allocator_type *)&local_60);
  LogicalType::LogicalType(local_c0 + 2,DECIMAL);
  GetReservoirQuantileDecimalFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_78,local_c0 + 2);
  LogicalType::~LogicalType(local_c0 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_c0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_c0,DECIMAL);
  LogicalType::LogicalType(local_c0 + 2,DOUBLE);
  LogicalType::LIST(local_c0 + 1,local_c0 + 2);
  __l_00._M_len = 2;
  __l_00._M_array = local_c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l_00,&local_c1);
  LogicalType::LogicalType(&local_48,DECIMAL);
  LogicalType::LIST(&local_60,&local_48);
  GetReservoirQuantileDecimalFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_78,&local_60);
  LogicalType::~LogicalType(&local_60);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_c0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(local_c0 + 2);
  LogicalType::LogicalType(local_c0,TINYINT);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  LogicalType::LogicalType(local_c0,SMALLINT);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  LogicalType::LogicalType(local_c0,INTEGER);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  LogicalType::LogicalType(local_c0,BIGINT);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  LogicalType::LogicalType(local_c0,HUGEINT);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  LogicalType::LogicalType(local_c0,FLOAT);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  LogicalType::LogicalType(local_c0,DOUBLE);
  DefineReservoirQuantile(in_RDI,local_c0);
  LogicalType::~LogicalType(local_c0);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ReservoirQuantileFun::GetFunctions() {
	AggregateFunctionSet reservoir_quantile;

	// DECIMAL
	GetReservoirQuantileDecimalFunction(reservoir_quantile, {LogicalTypeId::DECIMAL, LogicalType::DOUBLE},
	                                    LogicalTypeId::DECIMAL);
	GetReservoirQuantileDecimalFunction(reservoir_quantile,
	                                    {LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::DOUBLE)},
	                                    LogicalType::LIST(LogicalTypeId::DECIMAL));

	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::TINYINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::SMALLINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::INTEGER);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::BIGINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::HUGEINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::FLOAT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::DOUBLE);
	return reservoir_quantile;
}